

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarEnv.cpp
# Opt level: O2

void __thiscall VarEnv::display(VarEnv *this)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  
  for (p_Var2 = (this->vars)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->vars)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::operator<<((ostream *)&std::cout,"name : ");
    poVar1 = std::operator<<(poVar1,(string *)(p_Var2 + 1));
    std::endl<char,std::char_traits<char>>(poVar1);
    (**(code **)(**(long **)(p_Var2 + 2) + 0x18))();
  }
  return;
}

Assistant:

void VarEnv::display() {
    for (auto &i: vars) {
        std::cout << "name : " << i.first << std::endl;
        i.second->display();
    }
}